

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode_table * assembler::anon_unknown_0::make_fld_table(void)

{
  opcode_table *in_RDI;
  allocator<char> local_159;
  string local_158;
  opcode local_138;
  allocator<char> local_f1;
  string local_f0;
  opcode local_d0;
  allocator<char> local_79;
  string local_78;
  opcode local_58;
  undefined1 local_11;
  opcode_table *t;
  
  local_11 = 0;
  opcode_table::opcode_table(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"FLD",&local_79);
  make_opcode(&local_58,&local_78,4,0xd9,m32,none);
  opcode_table::add_opcode(in_RDI,&local_58);
  opcode::~opcode(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"FLD",&local_f1);
  make_opcode(&local_d0,&local_f0,4,0xdd,m64,none);
  opcode_table::add_opcode(in_RDI,&local_d0);
  opcode::~opcode(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"FLD",&local_159);
  make_opcode(&local_138,&local_158,0,0xd9,0xc0,sti,none);
  opcode_table::add_opcode(in_RDI,&local_138);
  opcode::~opcode(&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  return in_RDI;
}

Assistant:

opcode_table make_fld_table()
    {
    opcode_table t;
    t.add_opcode(make_opcode("FLD", opcode::digit0, 0xd9, opcode::m32, opcode::none));
    t.add_opcode(make_opcode("FLD", opcode::digit0, 0xdd, opcode::m64, opcode::none));
    t.add_opcode(make_opcode("FLD", 0, 0xd9, 0xc0, opcode::sti, opcode::none));
    return t;
    }